

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

__pid_t __thiscall crnlib::semaphore::wait(semaphore *this,void *__stat_loc)

{
  int *piVar1;
  int *extraout_RAX;
  undefined1 local_30 [8];
  timespec interval;
  int status;
  uint32 milliseconds_local;
  semaphore *this_local;
  
  interval.tv_nsec._4_4_ = (int)__stat_loc;
  if (interval.tv_nsec._4_4_ == -1) {
    interval.tv_nsec._0_4_ = sem_wait((sem_t *)this);
  }
  else {
    local_30 = (undefined1  [8])(((ulong)__stat_loc & 0xffffffff) / 1000);
    interval.tv_sec = (((ulong)__stat_loc & 0xffffffff) % 1000) * 1000000;
    interval.tv_nsec._0_4_ = sem_timedwait((sem_t *)this,(timespec *)local_30);
  }
  piVar1 = (int *)(ulong)(uint)interval.tv_nsec;
  if ((uint)interval.tv_nsec == 0) {
    this_local._7_1_ = 1;
  }
  else {
    piVar1 = __errno_location();
    if (*piVar1 != 0x6e) {
      crnlib_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_threading_pthreads.cpp"
                  ,0xe0);
      piVar1 = extraout_RAX;
    }
    this_local._7_1_ = 0;
  }
  return (__pid_t)CONCAT71((int7)((ulong)piVar1 >> 8),this_local._7_1_);
}

Assistant:

bool semaphore::wait(uint32 milliseconds)
    {
        int status;
        if (milliseconds == cUINT32_MAX)
        {
            status = sem_wait(&m_sem);
        }
        else
        {
            struct timespec interval;
            interval.tv_sec = milliseconds / 1000;
            interval.tv_nsec = (milliseconds % 1000) * 1000000L;
            status = sem_timedwait(&m_sem, &interval);
        }

        if (status)
        {
            if (errno != ETIMEDOUT)
            {
                CRNLIB_FAIL("semaphore: sem_wait() or sem_timedwait() failed");
            }
            return false;
        }

        return true;
    }